

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O1

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,ElementSelectExpression *sym)

{
  Expression *this_00;
  SourceLocation SVar1;
  ostream *poVar2;
  runtime_error *this_01;
  optional<long> oVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = sym->selector_;
  slang::ast::Expression::
  visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
            (sym->value_,sym->value_,this);
  if (this_00->constant == (ConstantValue *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18,".",1);
    slang::ast::Expression::
    visitExpression<slang::ast::Expression_const,hgdb::rtl::ExpressionPrinter&>
              (this_00,this_00,this);
    return;
  }
  oVar3 = get_constant_value(this_00->constant);
  if (((undefined1  [16])
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_40[0]._0_1_ = (string)0x5b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x18,(char *)local_40,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_40[0] = (undefined1 *)CONCAT71(local_40[0]._1_7_,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_40,1);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x20);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Only integer selection is supported","");
  SVar1 = *this->loc_;
  std::runtime_error::runtime_error(this_01,(string *)local_40);
  *(undefined ***)this_01 = &PTR__runtime_error_004e9040;
  *(SourceLocation *)(this_01 + 0x10) = SVar1;
  this_01[0x18] = (runtime_error)0x1;
  __cxa_throw(this_01,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void handle(const slang::ast::ElementSelectExpression &sym) {
        auto const &value = sym.value();
        auto const &selector = sym.selector();

        value.visit(*this);

        // depends on whether the selector is a constant or not
        std::optional<uint64_t> select_value;
        if (selector.constant) {
            auto const &v = *selector.constant;
            select_value = get_constant_value(v);
            if (select_value) {
                ss_ << '[' << *select_value << ']';
            } else {
                throw NotSupportedException("Only integer selection is supported", loc_);
            }
        } else {
            ss_ << ".";
            selector.visit(*this);
        }
    }